

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O2

int Curl_single_getsock(connectdata *conn,curl_socket_t *sock)

{
  _func_int_connectdata_ptr_curl_socket_t_ptr *UNRECOVERED_JUMPTABLE;
  Curl_easy *pCVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  
  UNRECOVERED_JUMPTABLE = conn->handler->perform_getsock;
  if (UNRECOVERED_JUMPTABLE != (_func_int_connectdata_ptr_curl_socket_t_ptr *)0x0) {
    iVar2 = (*UNRECOVERED_JUMPTABLE)(conn,sock);
    return iVar2;
  }
  pCVar1 = conn->data;
  uVar6 = (pCVar1->req).keepon;
  uVar4 = uVar6 & 0x15;
  if (uVar4 == 1) {
    *sock = conn->sockfd;
    uVar6 = (pCVar1->req).keepon;
  }
  uVar3 = (uint)(uVar4 == 1);
  if ((uVar6 & 0x2a) == 2) {
    if ((uVar4 == 1) && (conn->sockfd == conn->writesockfd)) {
      bVar5 = 0x10;
    }
    else {
      sock[uVar4 == 1] = conn->writesockfd;
      bVar5 = uVar4 == 1 | 0x10;
    }
    uVar3 = uVar3 | 1 << bVar5;
  }
  return uVar3;
}

Assistant:

int Curl_single_getsock(const struct connectdata *conn,
                        curl_socket_t *sock)
{
  const struct Curl_easy *data = conn->data;
  int bitmap = GETSOCK_BLANK;
  unsigned sockindex = 0;

  if(conn->handler->perform_getsock)
    return conn->handler->perform_getsock(conn, sock);

  /* don't include HOLD and PAUSE connections */
  if((data->req.keepon & KEEP_RECVBITS) == KEEP_RECV) {

    DEBUGASSERT(conn->sockfd != CURL_SOCKET_BAD);

    bitmap |= GETSOCK_READSOCK(sockindex);
    sock[sockindex] = conn->sockfd;
  }

  /* don't include HOLD and PAUSE connections */
  if((data->req.keepon & KEEP_SENDBITS) == KEEP_SEND) {

    if((conn->sockfd != conn->writesockfd) ||
       bitmap == GETSOCK_BLANK) {
      /* only if they are not the same socket and we have a readable
         one, we increase index */
      if(bitmap != GETSOCK_BLANK)
        sockindex++; /* increase index if we need two entries */

      DEBUGASSERT(conn->writesockfd != CURL_SOCKET_BAD);

      sock[sockindex] = conn->writesockfd;
    }

    bitmap |= GETSOCK_WRITESOCK(sockindex);
  }

  return bitmap;
}